

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void poolInit(STRING_POOL *pool,XML_Memory_Handling_Suite *ms)

{
  XML_Memory_Handling_Suite *ms_local;
  STRING_POOL *pool_local;
  
  pool->blocks = (BLOCK *)0x0;
  pool->freeBlocks = (BLOCK *)0x0;
  pool->start = (XML_Char *)0x0;
  pool->ptr = (XML_Char *)0x0;
  pool->end = (XML_Char *)0x0;
  pool->mem = ms;
  return;
}

Assistant:

static void FASTCALL
poolInit(STRING_POOL *pool, const XML_Memory_Handling_Suite *ms) {
  pool->blocks = NULL;
  pool->freeBlocks = NULL;
  pool->start = NULL;
  pool->ptr = NULL;
  pool->end = NULL;
  pool->mem = ms;
}